

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  Mat *this_02;
  size_t sVar1;
  int i;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int x_58;
  uint uVar13;
  float *pfVar14;
  void *pvVar15;
  int x_6;
  int x_61;
  int iVar16;
  long lVar17;
  float *pfVar18;
  int y_42;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int i_63;
  uint uVar22;
  int x_56;
  uint uVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  int local_a0;
  Mat local_90;
  ulong local_48;
  float *local_40;
  ulong local_38;
  
  if ((uint)this->op_type < 9) {
    this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    this_00 = this_01 + 1;
    this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    switch(this->op_type) {
    case 0:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) + fVar26
              ;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  *(float *)((long)pvVar9 + uVar4 * 4) =
                       *(float *)((long)pvVar6 + uVar4 * 4) + fVar26;
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              *(float *)((long)pvVar6 + uVar4 * 4) = *(float *)((long)pvVar9 + uVar4 * 4) + fVar26;
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) + fVar26
              ;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar15 + uVar12 * 4) + *(float *)((long)pvVar9 + uVar12 * 4);
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar6 + uVar21 * 4) =
                   *(float *)((long)pvVar15 + uVar21 * 4) + fVar26;
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar9 + uVar21 * 4) = *(float *)((long)pvVar6 + uVar21 * 4) + fVar26
              ;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    *(float *)((long)pvVar9 + uVar4 * 4) =
                         *(float *)((long)pvVar6 + uVar4 * 4) + fVar26;
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar9 + uVar21 * 4) =
                       *(float *)((long)pvVar6 + uVar21 * 4) + fVar26;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] + fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *pvVar9 + *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) + *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) + *pvVar6;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) + *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] + fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  pfVar18[uVar12] = *(float *)((long)pvVar6 + uVar12 * 4) + pfVar14[uVar12];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] + fVar26;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) + *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                pfVar18[uVar12] = pfVar14[uVar12] + *(float *)((long)pvVar6 + uVar12 * 4);
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                pfVar18[uVar7] = pfVar14[uVar7] + fVar26;
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar15 + uVar12 * 4) + *(float *)((long)pvVar9 + uVar12 * 4);
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) + fVar26;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar6 + uVar21 * 4) = *(float *)((long)pvVar9 + uVar21 * 4) + fVar26;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 1:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar26 - *(float *)((long)pvVar9 + uVar12 * 4)
              ;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  *(float *)((long)pvVar9 + uVar4 * 4) =
                       fVar26 - *(float *)((long)pvVar6 + uVar4 * 4);
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              *(float *)((long)pvVar6 + uVar4 * 4) = fVar26 - *(float *)((long)pvVar9 + uVar4 * 4);
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) - fVar26
              ;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar9 + uVar12 * 4) - *(float *)((long)pvVar15 + uVar12 * 4);
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar6 + uVar21 * 4) =
                   fVar26 - *(float *)((long)pvVar15 + uVar21 * 4);
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar9 + uVar21 * 4) = fVar26 - *(float *)((long)pvVar6 + uVar21 * 4)
              ;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    *(float *)((long)pvVar9 + uVar4 * 4) =
                         *(float *)((long)pvVar6 + uVar4 * 4) - fVar26;
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar9 + uVar21 * 4) =
                       *(float *)((long)pvVar6 + uVar21 * 4) - fVar26;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] - fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) - *pvVar9;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) - *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *pvVar6 - *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) - *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] - fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  pfVar18[uVar12] = pfVar14[uVar12] - *(float *)((long)pvVar6 + uVar12 * 4);
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = fVar26 - pfVar14[uVar8];
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) - *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                pfVar18[uVar12] = *(float *)((long)pvVar6 + uVar12 * 4) - pfVar14[uVar12];
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                pfVar18[uVar7] = fVar26 - pfVar14[uVar7];
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar9 + uVar12 * 4) - *(float *)((long)pvVar15 + uVar12 * 4);
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) - fVar26;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar6 + uVar21 * 4) = *(float *)((long)pvVar9 + uVar21 * 4) - fVar26;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 2:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) * fVar26
              ;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  *(float *)((long)pvVar9 + uVar4 * 4) =
                       *(float *)((long)pvVar6 + uVar4 * 4) * fVar26;
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              *(float *)((long)pvVar6 + uVar4 * 4) = *(float *)((long)pvVar9 + uVar4 * 4) * fVar26;
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) * fVar26
              ;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar15 + uVar12 * 4) * *(float *)((long)pvVar9 + uVar12 * 4);
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar6 + uVar21 * 4) =
                   *(float *)((long)pvVar15 + uVar21 * 4) * fVar26;
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar9 + uVar21 * 4) = *(float *)((long)pvVar6 + uVar21 * 4) * fVar26
              ;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    *(float *)((long)pvVar9 + uVar4 * 4) =
                         *(float *)((long)pvVar6 + uVar4 * 4) * fVar26;
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar9 + uVar21 * 4) =
                       *(float *)((long)pvVar6 + uVar21 * 4) * fVar26;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] * fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *pvVar9 * *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) * *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) * *pvVar6;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) * *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] * fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  pfVar18[uVar12] = *(float *)((long)pvVar6 + uVar12 * 4) * pfVar14[uVar12];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] * fVar26;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) * *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                pfVar18[uVar12] = pfVar14[uVar12] * *(float *)((long)pvVar6 + uVar12 * 4);
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                pfVar18[uVar7] = pfVar14[uVar7] * fVar26;
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar15 + uVar12 * 4) * *(float *)((long)pvVar9 + uVar12 * 4);
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) * fVar26;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar6 + uVar21 * 4) = *(float *)((long)pvVar9 + uVar21 * 4) * fVar26;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 3:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar26 / *(float *)((long)pvVar9 + uVar12 * 4)
              ;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  *(float *)((long)pvVar9 + uVar4 * 4) =
                       fVar26 / *(float *)((long)pvVar6 + uVar4 * 4);
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              *(float *)((long)pvVar6 + uVar4 * 4) = fVar26 / *(float *)((long)pvVar9 + uVar4 * 4);
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            fVar26 = *this_01[1].data;
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar9 + uVar12 * 4) * (1.0 / fVar26);
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar9 + uVar12 * 4) / *(float *)((long)pvVar15 + uVar12 * 4);
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar6 + uVar21 * 4) =
                   fVar26 / *(float *)((long)pvVar15 + uVar21 * 4);
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar9 + uVar21 * 4) = fVar26 / *(float *)((long)pvVar6 + uVar21 * 4)
              ;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                fVar26 = *this_00->data;
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    *(float *)((long)pvVar9 + uVar4 * 4) =
                         *(float *)((long)pvVar6 + uVar4 * 4) * (1.0 / fVar26);
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar9 + uVar21 * 4) =
                       *(float *)((long)pvVar6 + uVar21 * 4) * (1.0 / fVar26);
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] * (1.0 / fVar26);
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) / *pvVar9;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) / *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *pvVar6 / *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) / *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] * (1.0 / fVar26);
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  pfVar18[uVar12] = pfVar14[uVar12] / *(float *)((long)pvVar6 + uVar12 * 4);
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = fVar26 / pfVar14[uVar8];
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) / *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                pfVar18[uVar12] = *(float *)((long)pvVar6 + uVar12 * 4) / pfVar14[uVar12];
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                pfVar18[uVar7] = fVar26 / pfVar14[uVar7];
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar9 + uVar12 * 4) / *(float *)((long)pvVar15 + uVar12 * 4);
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          fVar26 = *this_01[1].data;
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar9 + uVar12 * 4) * (1.0 / fVar26);
          }
          return 0;
        }
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        pvVar9 = this_01->data;
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        pvVar15 = this_01[1].data;
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar6 + uVar21 * 4) =
                 *(float *)((long)pvVar9 + uVar21 * 4) * (1.0 / fVar26);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 4:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
              if (fVar27 <= fVar26) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  fVar27 = *(float *)((long)pvVar6 + uVar4 * 4);
                  if (*(float *)((long)pvVar6 + uVar4 * 4) <= fVar26) {
                    fVar27 = fVar26;
                  }
                  *(float *)((long)pvVar9 + uVar4 * 4) = fVar27;
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              fVar27 = *(float *)((long)pvVar9 + uVar4 * 4);
              if (fVar27 <= fVar26) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar4 * 4) = fVar27;
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
              if (fVar27 <= fVar26) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
              fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
              if (fVar26 <= fVar27) {
                fVar26 = fVar27;
              }
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar26;
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              fVar27 = *(float *)((long)pvVar15 + uVar21 * 4);
              if (fVar27 <= fVar26) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar21 * 4) = fVar27;
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              fVar27 = *(float *)((long)pvVar6 + uVar21 * 4);
              if (*(float *)((long)pvVar6 + uVar21 * 4) <= fVar26) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar9 + uVar21 * 4) = fVar27;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    fVar27 = *(float *)((long)pvVar6 + uVar4 * 4);
                    if (*(float *)((long)pvVar6 + uVar4 * 4) <= fVar26) {
                      fVar27 = fVar26;
                    }
                    *(float *)((long)pvVar9 + uVar4 * 4) = fVar27;
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  fVar27 = *(float *)((long)pvVar6 + uVar21 * 4);
                  if (*(float *)((long)pvVar6 + uVar21 * 4) <= fVar26) {
                    fVar27 = fVar26;
                  }
                  *(float *)((long)pvVar9 + uVar21 * 4) = fVar27;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  fVar27 = pfVar14[uVar8];
                  if (pfVar14[uVar8] <= fVar26) {
                    fVar27 = fVar26;
                  }
                  pfVar18[uVar8] = fVar27;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *pvVar9;
                if (*pvVar9 <= *(float *)((long)pvVar6 + uVar4 * 4)) {
                  fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                if (fVar26 <= *(float *)((long)pvVar9 + uVar4 * 4)) {
                  fVar26 = *(float *)((long)pvVar9 + uVar4 * 4);
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar9 + uVar4 * 4);
                if (*(float *)((long)pvVar9 + uVar4 * 4) <= *pvVar6) {
                  fVar26 = *pvVar6;
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                fVar27 = *(float *)((long)pvVar9 + uVar4 * 4);
                if (*(float *)((long)pvVar9 + uVar4 * 4) <= fVar26) {
                  fVar27 = fVar26;
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar27;
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  fVar27 = pfVar14[uVar8];
                  if (pfVar14[uVar8] <= fVar26) {
                    fVar27 = fVar26;
                  }
                  pfVar18[uVar8] = fVar27;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  fVar26 = *(float *)((long)pvVar6 + uVar12 * 4);
                  if (*(float *)((long)pvVar6 + uVar12 * 4) <= pfVar14[uVar12]) {
                    fVar26 = pfVar14[uVar12];
                  }
                  pfVar18[uVar12] = fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  fVar27 = pfVar14[uVar8];
                  if (pfVar14[uVar8] <= fVar26) {
                    fVar27 = fVar26;
                  }
                  pfVar18[uVar8] = fVar27;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar9 + uVar4 * 4);
                if (*(float *)((long)pvVar9 + uVar4 * 4) <= *(float *)((long)pvVar6 + uVar4 * 4)) {
                  fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                fVar26 = pfVar14[uVar12];
                if (pfVar14[uVar12] <= *(float *)((long)pvVar6 + uVar12 * 4)) {
                  fVar26 = *(float *)((long)pvVar6 + uVar12 * 4);
                }
                pfVar18[uVar12] = fVar26;
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                fVar27 = pfVar14[uVar7];
                if (pfVar14[uVar7] <= fVar26) {
                  fVar27 = fVar26;
                }
                pfVar18[uVar7] = fVar27;
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
            fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
            if (fVar26 <= fVar27) {
              fVar26 = fVar27;
            }
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar26;
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
            if (fVar27 <= fVar26) {
              fVar27 = fVar26;
            }
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            fVar27 = *(float *)((long)pvVar9 + uVar21 * 4);
            if (fVar27 <= fVar26) {
              fVar27 = fVar26;
            }
            *(float *)((long)pvVar6 + uVar21 * 4) = fVar27;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 5:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
              if (fVar26 <= fVar27) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  fVar27 = *(float *)((long)pvVar6 + uVar4 * 4);
                  if (fVar26 <= *(float *)((long)pvVar6 + uVar4 * 4)) {
                    fVar27 = fVar26;
                  }
                  *(float *)((long)pvVar9 + uVar4 * 4) = fVar27;
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              fVar27 = *(float *)((long)pvVar9 + uVar4 * 4);
              if (fVar26 <= fVar27) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar4 * 4) = fVar27;
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
              if (fVar26 <= fVar27) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
              fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
              if (fVar27 <= fVar26) {
                fVar26 = fVar27;
              }
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar26;
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              fVar27 = *(float *)((long)pvVar15 + uVar21 * 4);
              if (fVar26 <= fVar27) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar6 + uVar21 * 4) = fVar27;
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              fVar27 = *(float *)((long)pvVar6 + uVar21 * 4);
              if (fVar26 <= *(float *)((long)pvVar6 + uVar21 * 4)) {
                fVar27 = fVar26;
              }
              *(float *)((long)pvVar9 + uVar21 * 4) = fVar27;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    fVar27 = *(float *)((long)pvVar6 + uVar4 * 4);
                    if (fVar26 <= *(float *)((long)pvVar6 + uVar4 * 4)) {
                      fVar27 = fVar26;
                    }
                    *(float *)((long)pvVar9 + uVar4 * 4) = fVar27;
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  fVar27 = *(float *)((long)pvVar6 + uVar21 * 4);
                  if (fVar26 <= *(float *)((long)pvVar6 + uVar21 * 4)) {
                    fVar27 = fVar26;
                  }
                  *(float *)((long)pvVar9 + uVar21 * 4) = fVar27;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  fVar27 = pfVar14[uVar8];
                  if (fVar26 <= pfVar14[uVar8]) {
                    fVar27 = fVar26;
                  }
                  pfVar18[uVar8] = fVar27;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *pvVar9;
                if (*(float *)((long)pvVar6 + uVar4 * 4) <= *pvVar9) {
                  fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                if (*(float *)((long)pvVar9 + uVar4 * 4) <= fVar26) {
                  fVar26 = *(float *)((long)pvVar9 + uVar4 * 4);
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar9 + uVar4 * 4);
                if (*pvVar6 <= *(float *)((long)pvVar9 + uVar4 * 4)) {
                  fVar26 = *pvVar6;
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                fVar27 = *(float *)((long)pvVar9 + uVar4 * 4);
                if (fVar26 <= *(float *)((long)pvVar9 + uVar4 * 4)) {
                  fVar27 = fVar26;
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar27;
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  fVar27 = pfVar14[uVar8];
                  if (fVar26 <= pfVar14[uVar8]) {
                    fVar27 = fVar26;
                  }
                  pfVar18[uVar8] = fVar27;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  fVar26 = *(float *)((long)pvVar6 + uVar12 * 4);
                  if (pfVar14[uVar12] <= *(float *)((long)pvVar6 + uVar12 * 4)) {
                    fVar26 = pfVar14[uVar12];
                  }
                  pfVar18[uVar12] = fVar26;
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  fVar27 = pfVar14[uVar8];
                  if (fVar26 <= pfVar14[uVar8]) {
                    fVar27 = fVar26;
                  }
                  pfVar18[uVar8] = fVar27;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = *(float *)((long)pvVar9 + uVar4 * 4);
                if (*(float *)((long)pvVar6 + uVar4 * 4) <= *(float *)((long)pvVar9 + uVar4 * 4)) {
                  fVar26 = *(float *)((long)pvVar6 + uVar4 * 4);
                }
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                fVar26 = pfVar14[uVar12];
                if (*(float *)((long)pvVar6 + uVar12 * 4) <= pfVar14[uVar12]) {
                  fVar26 = *(float *)((long)pvVar6 + uVar12 * 4);
                }
                pfVar18[uVar12] = fVar26;
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                fVar27 = pfVar14[uVar7];
                if (fVar26 <= pfVar14[uVar7]) {
                  fVar27 = fVar26;
                }
                pfVar18[uVar7] = fVar27;
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
            fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
            if (fVar27 <= fVar26) {
              fVar26 = fVar27;
            }
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar26;
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar27 = *(float *)((long)pvVar9 + uVar12 * 4);
            if (fVar26 <= fVar27) {
              fVar27 = fVar26;
            }
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            fVar27 = *(float *)((long)pvVar9 + uVar21 * 4);
            if (fVar26 <= fVar27) {
              fVar27 = fVar26;
            }
            *(float *)((long)pvVar6 + uVar21 * 4) = fVar27;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 6:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar4 = (ulong)uVar22;
      uVar10 = this_01[1].c;
      local_48 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 != 1) {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 == 2) {
          if (this_01[1].dims == 3) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            if ((int)uVar22 < 1) {
              uVar4 = 0;
            }
            iVar16 = (int)local_48;
            local_48 = local_48 & 0xffffffff;
            if (iVar16 < 1) {
              local_48 = 0;
            }
            uVar21 = 0;
            while (uVar21 != local_48) {
              local_40 = (float *)((long)this_01->w * uVar21 * this_01->elemsize +
                                  (long)this_01->data);
              ncnn::Mat::channel(&local_90,this_00,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              local_38 = uVar21;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
                fVar26 = *(float *)((long)local_40 + uVar21 * 4);
                for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
                  fVar27 = powf(fVar26,pfVar14[uVar5]);
                  pfVar18[uVar5] = fVar27;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
              uVar21 = local_38 + 1;
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims != 1) {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
              fVar26 = powf(*(float *)((long)pvVar9 + uVar4 * 4),
                            *(float *)((long)pvVar15 + uVar4 * 4));
              *(float *)((long)pvVar6 + uVar4 * 4) = fVar26;
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
              fVar27 = powf(*(float *)((long)pvVar9 + uVar4 * 4),fVar26);
              *(float *)((long)pvVar6 + uVar4 * 4) = fVar27;
            }
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              fVar27 = powf(*(float *)((long)pvVar9 + uVar21 * 4),fVar26);
              *(float *)((long)pvVar6 + uVar21 * 4) = fVar27;
            }
            pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
            pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
          }
          return 0;
        }
        if (iVar16 != 3) {
          return 0;
        }
        uVar19 = this_01->c;
        uVar12 = (ulong)uVar19;
        if (this_01[1].dims == 3) {
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            local_48 = uVar12;
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = powf(*(float *)((long)pvVar6 + uVar4 * 4),*pvVar9);
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            local_48 = uVar12;
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = powf(*(float *)((long)pvVar9 + uVar4 * 4),
                              *(float *)((long)pvVar6 + uVar4 * 4));
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            local_48 = uVar12;
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = powf(*pvVar6,*(float *)((long)pvVar9 + uVar4 * 4));
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            iVar16 = (int)local_48;
            local_48 = local_48 & 0xffffffff;
            if (iVar16 < 1) {
              local_48 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = powf(*(float *)((long)pvVar6 + uVar4 * 4),
                              *(float *)((long)pvVar9 + uVar4 * 4));
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            local_40 = (float *)(lVar25 << 2);
            iVar16 = 0;
            local_48 = uVar12;
            while (iVar16 != (int)local_48) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              local_38 = CONCAT44(local_38._4_4_,iVar16);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar12 * 4);
                for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
                  fVar27 = powf(pfVar14[uVar21],fVar26);
                  pfVar18[uVar21] = fVar27;
                }
                pfVar18 = (float *)((long)pfVar18 + (long)local_40);
                pfVar14 = (float *)((long)pfVar14 + (long)local_40);
              }
              iVar16 = (int)local_38 + 1;
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            local_40 = (float *)(lVar25 << 2);
            local_48 = uVar12;
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar23 = 0; uVar23 != uVar20; uVar23 = uVar23 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  fVar26 = powf(pfVar14[uVar12],*(float *)((long)pvVar6 + uVar12 * 4));
                  pfVar18[uVar12] = fVar26;
                }
                pfVar18 = (float *)((long)pfVar18 + (long)local_40);
                pfVar14 = (float *)((long)pfVar14 + (long)local_40);
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            iVar16 = 0;
            local_48 = uVar12;
            while (iVar16 != (int)local_48) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              local_40 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              local_38 = CONCAT44(local_38._4_4_,iVar16);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
                fVar26 = local_40[uVar12];
                for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
                  fVar27 = powf(fVar26,pfVar14[uVar21]);
                  pfVar18[uVar21] = fVar27;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
              iVar16 = (int)local_38 + 1;
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar12 = 0;
            }
            local_48 = uVar12;
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar26 = powf(*(float *)((long)pvVar6 + uVar4 * 4),
                              *(float *)((long)pvVar9 + uVar4 * 4));
                *(float *)((long)pvVar15 + uVar4 * 4) = fVar26;
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar21 = 0;
          if (0 < (int)uVar23) {
            uVar21 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar4 = 0;
          }
          local_48 = uVar12;
          if ((int)uVar19 < 1) {
            local_48 = 0;
          }
          local_40 = (float *)(lVar25 << 2);
          for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
            ncnn::Mat::channel(&local_90,this_01,iVar16);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,iVar16);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,iVar16);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (iVar24 = 0; local_a0 = (int)uVar4, iVar24 != local_a0; iVar24 = iVar24 + 1) {
              for (uVar12 = 0; uVar21 != uVar12; uVar12 = uVar12 + 1) {
                fVar26 = powf(*(float *)((long)pvVar6 + uVar12 * 4),pfVar14[uVar12]);
                pfVar18[uVar12] = fVar26;
              }
              pfVar18 = (float *)((long)pfVar18 + (long)local_40);
              pfVar14 = (float *)((long)pfVar14 + (long)local_40);
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (this_01[1].w == 1) {
            fVar26 = *this_00->data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            local_48 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              local_48 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                fVar27 = powf(*(float *)((long)pvVar6 + uVar4 * 4),fVar26);
                *(float *)((long)pvVar9 + uVar4 * 4) = fVar27;
              }
            }
            return 0;
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          local_48 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            local_48 = 0;
          }
          for (uVar4 = 0; uVar4 != local_48; uVar4 = uVar4 + 1) {
            ncnn::Mat::channel(&local_90,this_01,(int)uVar4);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            fVar26 = *(float *)((long)this_01[1].data + uVar4 * 4);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar4);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
              fVar27 = powf(*(float *)((long)pvVar6 + uVar12 * 4),fVar26);
              *(float *)((long)pvVar9 + uVar12 * 4) = fVar27;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        if ((int)uVar19 < 1) {
          uVar12 = 0;
        }
        local_40 = (float *)(lVar25 << 2);
        local_48 = uVar12;
        for (uVar21 = 0; uVar21 != local_48; uVar21 = uVar21 + 1) {
          ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
          pfVar14 = (float *)local_90.data;
          ncnn::Mat::~Mat(&local_90);
          iVar16 = this_01[1].w;
          sVar1 = this_01[1].elemsize;
          pvVar6 = this_01[1].data;
          ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
          pfVar18 = (float *)local_90.data;
          ncnn::Mat::~Mat(&local_90);
          for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar6 + uVar12 * 4 + (long)iVar16 * uVar21 * sVar1);
            for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
              fVar27 = powf(pfVar14[uVar5],fVar26);
              pfVar18[uVar5] = fVar27;
            }
            pfVar18 = (float *)((long)pfVar18 + (long)local_40);
            pfVar14 = (float *)((long)pfVar14 + (long)local_40);
          }
        }
        return 0;
      }
      iVar16 = this_01[1].dims;
      if (uVar23 == 1) {
        if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01[1].data;
          fVar26 = *this_01->data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar27 = powf(fVar26,*(float *)((long)pvVar9 + uVar12 * 4));
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
          }
        }
        else {
          if (iVar16 != 2) {
            if (iVar16 != 3) {
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            iVar16 = (int)local_48;
            local_48 = local_48 & 0xffffffff;
            if (iVar16 < 1) {
              local_48 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)local_48; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                fVar27 = powf(fVar26,*(float *)((long)pvVar6 + uVar4 * 4));
                *(float *)((long)pvVar9 + uVar4 * 4) = fVar27;
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01[1].data;
          fVar26 = *this_01->data;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
            fVar27 = powf(fVar26,*(float *)((long)pvVar9 + uVar4 * 4));
            *(float *)((long)pvVar6 + uVar4 * 4) = fVar27;
          }
        }
      }
      else {
        if (iVar16 != 1) {
          if (iVar16 == 2) {
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            if ((int)uVar22 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              fVar26 = *(float *)((long)pvVar9 + uVar21 * 4);
              for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
                fVar27 = powf(fVar26,*(float *)((long)pvVar15 + uVar5 * 4));
                *(float *)((long)pvVar6 + uVar5 * 4) = fVar27;
              }
              pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
            }
            return 0;
          }
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          iVar16 = (int)local_48;
          local_48 = local_48 & 0xffffffff;
          if (iVar16 < 1) {
            local_48 = 0;
          }
          for (uVar4 = 0; uVar4 != local_48; uVar4 = uVar4 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar4 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar4);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar4);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
              fVar27 = powf(fVar26,*(float *)((long)pvVar6 + uVar12 * 4));
              *(float *)((long)pvVar9 + uVar12 * 4) = fVar27;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar27 = powf(*(float *)((long)pvVar9 + uVar12 * 4),fVar26);
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar27;
          }
        }
        else {
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            fVar26 = powf(*(float *)((long)pvVar9 + uVar12 * 4),
                          *(float *)((long)pvVar15 + uVar12 * 4));
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar26;
          }
        }
      }
      break;
    case 7:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = *(float *)((long)pvVar9 + uVar12 * 4) - fVar26
              ;
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar26 = *this_01->data;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  *(float *)((long)pvVar9 + uVar4 * 4) =
                       *(float *)((long)pvVar6 + uVar4 * 4) - fVar26;
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar26 = *this_01->data;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
              *(float *)((long)pvVar6 + uVar4 * 4) = *(float *)((long)pvVar9 + uVar4 * 4) - fVar26;
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar26 - *(float *)((long)pvVar9 + uVar12 * 4)
              ;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar15 + uVar12 * 4) - *(float *)((long)pvVar9 + uVar12 * 4);
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar6 + uVar21 * 4) =
                   *(float *)((long)pvVar15 + uVar21 * 4) - fVar26;
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar9 + uVar21 * 4) = *(float *)((long)pvVar6 + uVar21 * 4) - fVar26
              ;
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    *(float *)((long)pvVar9 + uVar4 * 4) =
                         fVar26 - *(float *)((long)pvVar6 + uVar4 * 4);
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar9 + uVar21 * 4) =
                       fVar26 - *(float *)((long)pvVar6 + uVar21 * 4);
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = fVar26 - pfVar14[uVar8];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *pvVar9 - *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) - *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) - *pvVar6;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) - *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = fVar26 - pfVar14[uVar8];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  pfVar18[uVar12] = *(float *)((long)pvVar6 + uVar12 * 4) - pfVar14[uVar12];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] - fVar26;
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) - *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                pfVar18[uVar12] = pfVar14[uVar12] - *(float *)((long)pvVar6 + uVar12 * 4);
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                pfVar18[uVar7] = pfVar14[uVar7] - fVar26;
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar15 + uVar12 * 4) - *(float *)((long)pvVar9 + uVar12 * 4);
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar26 - *(float *)((long)pvVar9 + uVar12 * 4);
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar6 + uVar21 * 4) = fVar26 - *(float *)((long)pvVar9 + uVar21 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
      break;
    case 8:
      uVar23 = this_01->w;
      lVar25 = (long)(int)uVar23;
      sVar1 = this_01->elemsize;
      uVar3 = this_01[1].w;
      lVar17 = (long)(int)uVar3;
      uVar22 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar4 = (ulong)uVar10;
      uVar11 = uVar22 * uVar3;
      iVar16 = this_01->dims;
      if (iVar16 == 1) {
        iVar16 = this_01[1].dims;
        if (uVar23 == 1) {
          if (iVar16 == 1) {
            ncnn::Mat::create(this_02,uVar3,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar3) {
              uVar4 = (ulong)uVar3;
            }
            fVar26 = *this_01->data;
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar9 + uVar12 * 4) * (1.0 / fVar26);
            }
          }
          else {
            if (iVar16 != 2) {
              if (iVar16 != 3) {
                return 0;
              }
              ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              fVar26 = *this_01->data;
              for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
                ncnn::Mat::channel(&local_90,this_00,uVar23);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                ncnn::Mat::channel(&local_90,this_02,uVar23);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                  *(float *)((long)pvVar9 + uVar4 * 4) =
                       *(float *)((long)pvVar6 + uVar4 * 4) * (1.0 / fVar26);
                }
              }
              return 0;
            }
            ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            uVar4 = (ulong)uVar11;
            if ((int)uVar11 < 1) {
              uVar4 = 0;
            }
            fVar26 = *this_01->data;
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar9 + uVar12 * 4) * (1.0 / fVar26);
            }
          }
        }
        else if (iVar16 == 1) {
          ncnn::Mat::create(this_02,uVar23,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar26 = *this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) = fVar26 / *(float *)((long)pvVar9 + uVar12 * 4)
              ;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar15 = this_01[1].data;
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar6 + uVar12 * 4) =
                   *(float *)((long)pvVar15 + uVar12 * 4) / *(float *)((long)pvVar9 + uVar12 * 4);
            }
          }
        }
        else if (iVar16 == 2) {
          ncnn::Mat::create(this_02,uVar3,uVar22,sVar1,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          pvVar9 = this_01->data;
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          pvVar15 = this_01[1].data;
          for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)pvVar9 + uVar12 * 4);
            for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar6 + uVar21 * 4) =
                   *(float *)((long)pvVar15 + uVar21 * 4) * (1.0 / fVar26);
            }
            pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar17 * 4);
          }
        }
        else {
          if (iVar16 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            fVar26 = *(float *)((long)this_01->data + uVar12 * 4);
            ncnn::Mat::channel(&local_90,this_00,(int)uVar12);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
            pvVar9 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              *(float *)((long)pvVar9 + uVar21 * 4) =
                   *(float *)((long)pvVar6 + uVar21 * 4) * (1.0 / fVar26);
            }
          }
        }
      }
      else {
        uVar20 = this_01->h;
        uVar13 = uVar20 * uVar23;
        if (iVar16 != 2) {
          if (iVar16 != 3) {
            return 0;
          }
          uVar19 = this_01->c;
          uVar4 = (ulong)uVar19;
          if (this_01[1].dims != 3) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar26 = *this_00->data;
                if ((int)uVar13 < 1) {
                  uVar13 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
                  ncnn::Mat::channel(&local_90,this_01,uVar23);
                  pvVar6 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  ncnn::Mat::channel(&local_90,this_02,uVar23);
                  pvVar9 = local_90.data;
                  ncnn::Mat::~Mat(&local_90);
                  for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                    *(float *)((long)pvVar9 + uVar4 * 4) =
                         fVar26 / *(float *)((long)pvVar6 + uVar4 * 4);
                  }
                }
                return 0;
              }
              if ((int)uVar13 < 1) {
                uVar13 = 0;
              }
              if ((int)uVar19 < 1) {
                uVar4 = 0;
              }
              for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                ncnn::Mat::channel(&local_90,this_01,(int)uVar12);
                pvVar6 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                fVar26 = *(float *)((long)this_01[1].data + uVar12 * 4);
                ncnn::Mat::channel(&local_90,this_02,(int)uVar12);
                pvVar9 = local_90.data;
                ncnn::Mat::~Mat(&local_90);
                for (uVar21 = 0; uVar13 != uVar21; uVar21 = uVar21 + 1) {
                  *(float *)((long)pvVar9 + uVar21 * 4) =
                       fVar26 / *(float *)((long)pvVar6 + uVar21 * 4);
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (float *)(ulong)uVar20;
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar4; uVar21 = uVar21 + 1) {
              ncnn::Mat::channel(&local_90,this_01,(int)uVar21);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              iVar16 = this_01[1].w;
              sVar1 = this_01[1].elemsize;
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,(int)uVar21);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; (float *)uVar5 != local_40; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar16 * uVar21 * sVar1);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = fVar26 / pfVar14[uVar8];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          uVar2 = uVar10 ^ uVar19;
          if ((uVar3 == 1 && (uVar22 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *pvVar9 / *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar10 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              pvVar6 = this_01[1].data;
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar6 + uVar4 * 4) / *(float *)((long)pvVar9 + uVar4 * 4);
              }
            }
            return 0;
          }
          if ((uVar23 == 1 && (uVar20 ^ 1) == 0) && uVar2 == 0) {
            ncnn::Mat::create(this_02,uVar3,uVar22,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) / *pvVar6;
              }
            }
            return 0;
          }
          if ((uVar3 == uVar23) && (uVar19 == 1 && uVar22 == uVar20)) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar10,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar10; uVar23 = uVar23 + 1) {
              pvVar6 = this_01->data;
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) / *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          if (((uVar3 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar23 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar23) {
              uVar12 = (ulong)uVar23;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = fVar26 / pfVar14[uVar8];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == uVar3 && (uVar22 ^ 1) == 0) && uVar2 == 0) && uVar20 != 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar4 = 0;
            if (0 < (int)uVar23) {
              uVar4 = (ulong)uVar23;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar3 = 0; uVar3 != uVar20; uVar3 = uVar3 + 1) {
                for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                  pfVar18[uVar12] = *(float *)((long)pvVar6 + uVar12 * 4) / pfVar14[uVar12];
                }
                pfVar18 = pfVar18 + lVar25;
                pfVar14 = pfVar14 + lVar25;
              }
            }
            return 0;
          }
          if (((uVar23 == 1 && (uVar22 ^ uVar20) == 0) && uVar2 == 0) && uVar3 != 1) {
            ncnn::Mat::create(this_02,uVar3,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar12 = 0;
            if (0 < (int)uVar3) {
              uVar12 = (ulong)uVar3;
            }
            uVar21 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar4 = 0;
            }
            for (iVar16 = 0; iVar16 != (int)uVar4; iVar16 = iVar16 + 1) {
              ncnn::Mat::channel(&local_90,this_01,iVar16);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,iVar16);
              pfVar14 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,iVar16);
              pfVar18 = (float *)local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar5 = 0; uVar5 != uVar21; uVar5 = uVar5 + 1) {
                fVar26 = *(float *)((long)pvVar6 + uVar5 * 4);
                for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar18[uVar8] = pfVar14[uVar8] * (1.0 / fVar26);
                }
                pfVar18 = pfVar18 + lVar17;
                pfVar14 = pfVar14 + lVar17;
              }
            }
            return 0;
          }
          if (((uVar23 != uVar3 || (uVar20 ^ 1) != 0) || uVar2 != 0) || uVar22 == 1) {
            ncnn::Mat::create(this_02,uVar23,uVar20,uVar19,sVar1,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
              ncnn::Mat::channel(&local_90,this_01,uVar23);
              pvVar6 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_00,uVar23);
              pvVar9 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              ncnn::Mat::channel(&local_90,this_02,uVar23);
              pvVar15 = local_90.data;
              ncnn::Mat::~Mat(&local_90);
              for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
                *(float *)((long)pvVar15 + uVar4 * 4) =
                     *(float *)((long)pvVar9 + uVar4 * 4) / *(float *)((long)pvVar6 + uVar4 * 4);
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar23,uVar22,uVar19,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar4 = 0;
          if (0 < (int)uVar23) {
            uVar4 = (ulong)uVar23;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
            ncnn::Mat::channel(&local_90,this_01,uVar23);
            pvVar6 = local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_00,uVar23);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,uVar23);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar3 = 0; uVar3 != uVar22; uVar3 = uVar3 + 1) {
              for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                pfVar18[uVar12] = pfVar14[uVar12] / *(float *)((long)pvVar6 + uVar12 * 4);
              }
              pfVar18 = pfVar18 + lVar25;
              pfVar14 = pfVar14 + lVar25;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar3,uVar22,uVar10,sVar1,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar12 = 0;
          if (0 < (int)uVar3) {
            uVar12 = (ulong)uVar3;
          }
          uVar21 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar4 = 0;
          }
          for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
            iVar16 = this_01->w;
            sVar1 = this_01->elemsize;
            pvVar6 = this_01->data;
            ncnn::Mat::channel(&local_90,this_00,(int)uVar5);
            pfVar14 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            ncnn::Mat::channel(&local_90,this_02,(int)uVar5);
            pfVar18 = (float *)local_90.data;
            ncnn::Mat::~Mat(&local_90);
            for (uVar8 = 0; uVar8 != uVar21; uVar8 = uVar8 + 1) {
              fVar26 = *(float *)((long)pvVar6 + uVar8 * 4 + (long)iVar16 * uVar5 * sVar1);
              for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
                pfVar18[uVar7] = pfVar14[uVar7] * (1.0 / fVar26);
              }
              pfVar18 = pfVar18 + lVar17;
              pfVar14 = pfVar14 + lVar17;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if ((pvVar6 == (void *)0x0) || ((long)this_02->c * this_02->cstep == 0)) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar15 = this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) =
                 *(float *)((long)pvVar15 + uVar12 * 4) / *(float *)((long)pvVar9 + uVar12 * 4);
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar23,uVar20,sVar1,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar26 = *this_01[1].data;
          uVar4 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar4 = 0;
          }
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar6 + uVar12 * 4) = fVar26 / *(float *)((long)pvVar9 + uVar12 * 4);
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar15 = this_01[1].data;
        uVar4 = 0;
        if (0 < (int)uVar23) {
          uVar4 = (ulong)uVar23;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
          fVar26 = *(float *)((long)pvVar15 + uVar12 * 4);
          for (uVar21 = 0; uVar4 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar6 + uVar21 * 4) = fVar26 / *(float *)((long)pvVar9 + uVar21 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar25 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar25 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_rsub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_rdiv>(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}